

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4_int8.h
# Opt level: O1

void ncnn::conv3x3s1_pack1to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int *piVar8;
  long lVar9;
  undefined1 *puVar10;
  int u;
  long lVar11;
  int v;
  long lVar12;
  undefined1 *puVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int i;
  int iVar17;
  long lVar18;
  Mat local_a8;
  Mat *local_58;
  Mat *local_50;
  Option *local_48;
  long local_40;
  Mat *local_38;
  
  iVar1 = bottom_blob->w;
  lVar18 = (long)bottom_blob->c;
  uVar2 = top_blob->w;
  iVar3 = top_blob->h;
  local_a8.cstep = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 0;
  local_a8.allocator = (Allocator *)0x0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.d = 0;
  local_a8.c = 0;
  local_58 = top_blob;
  local_50 = kernel;
  local_48 = opt;
  local_38 = bottom_blob;
  Mat::create(&local_a8,iVar3 * uVar2,9,bottom_blob->c,1,1,opt->workspace_allocator);
  if (0 < lVar18) {
    lVar9 = 0;
    do {
      iVar4 = local_38->w;
      sVar5 = local_38->cstep;
      sVar6 = local_38->elemsize;
      pvVar7 = local_38->data;
      puVar10 = (undefined1 *)
                (local_a8.cstep * lVar9 *
                 CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) +
                (long)local_a8.data);
      lVar11 = 0;
      do {
        lVar12 = 0;
        do {
          if (0 < iVar3) {
            puVar13 = (undefined1 *)
                      ((long)pvVar7 + lVar12 + (long)iVar4 * sVar6 * lVar11 + sVar5 * lVar9 * sVar6)
            ;
            iVar17 = 0;
            do {
              if ((int)uVar2 < 4) {
                uVar16 = 0;
              }
              else {
                iVar15 = 3;
                do {
                  *puVar10 = *puVar13;
                  puVar10[1] = puVar13[1];
                  puVar10[2] = puVar13[2];
                  puVar10[3] = puVar13[3];
                  puVar13 = puVar13 + 4;
                  puVar10 = puVar10 + 4;
                  iVar15 = iVar15 + 4;
                  uVar16 = uVar2 & 0xfffffffc;
                } while (iVar15 < (int)uVar2);
              }
              uVar14 = uVar16 | 1;
              while ((int)uVar14 < (int)uVar2) {
                *puVar10 = *puVar13;
                puVar10[1] = puVar13[1];
                puVar13 = puVar13 + 2;
                puVar10 = puVar10 + 2;
                uVar14 = uVar16 + 3;
                uVar16 = uVar16 + 2;
              }
              if ((int)uVar16 < (int)uVar2) {
                iVar15 = uVar2 - uVar16;
                do {
                  *puVar10 = *puVar13;
                  puVar13 = puVar13 + 1;
                  puVar10 = puVar10 + 1;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              puVar13 = puVar13 + ((long)iVar1 - (long)(int)uVar2);
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar3);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar18);
  }
  local_40 = lVar18;
  im2col_sgemm_pack1to4_int8_sse(&local_a8,local_58,local_50,local_48);
  piVar8 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = 9;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 1u, 1, opt.workspace_allocator);
    {
        const int gap = w - outw;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            signed char* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < 3; u++)
            {
                for (int v = 0; v < 3; v++)
                {
                    const signed char* sptr = img.row<const signed char>(u) + v;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j + 3 < outw; j += 4)
                        {
                            ptr[0] = sptr[0];
                            ptr[1] = sptr[1];
                            ptr[2] = sptr[2];
                            ptr[3] = sptr[3];

                            sptr += 4;
                            ptr += 4;
                        }
                        for (; j + 1 < outw; j += 2)
                        {
                            ptr[0] = sptr[0];
                            ptr[1] = sptr[1];

                            sptr += 2;
                            ptr += 2;
                        }
                        for (; j < outw; j++)
                        {
                            ptr[0] = sptr[0];

                            sptr += 1;
                            ptr += 1;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}